

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O1

void __thiscall
glcts::ViewportArray::DrawTestBase::setup16x2Depths(DrawTestBase *this,DEPTH_RANGE_METHOD method)

{
  uint uVar1;
  
  uVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  if ((uVar1 & 0x300) == 0x100) {
    setup16x2DepthsHelper<double>(this,method,(double *)0x0);
    return;
  }
  setup16x2DepthsHelper<float>(this,method,(float *)0x0);
  return;
}

Assistant:

void DrawTestBase::setup16x2Depths(DEPTH_RANGE_METHOD method)
{
	const glu::ContextType& context_type = m_context.getRenderContext().getType();

	if (glu::isContextTypeGLCore(context_type))
	{
		setup16x2DepthsHelper<GLdouble>(method);
	}
	else
	{
		DE_ASSERT(glu::isContextTypeES(context_type));
		setup16x2DepthsHelper<GLfloat>(method);
	}
}